

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddTestCommand.cxx
# Opt level: O0

bool __thiscall
cmAddTestCommand::HandleNameMode
          (cmAddTestCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong uVar4;
  ostream *poVar5;
  cmTest *pcVar6;
  char *value;
  cmTestGenerator *this_01;
  allocator<char> local_4f9;
  string local_4f8;
  cmTest *local_4d8;
  cmTest *test;
  undefined1 local_4b0 [8];
  ostringstream e_1;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  string local_2e8;
  undefined1 local_2c8 [8];
  ostringstream e;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  undefined4 local_d8;
  allocator<char> local_d1;
  string local_d0;
  uint local_9c;
  int local_98;
  uint i;
  Doing doing;
  bool command_expand_lists;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string working_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurations;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmAddTestCommand *this_local;
  
  std::__cxx11::string::string
            ((string *)
             &configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&working_directory.field_2 + 8));
  std::__cxx11::string::string
            ((string *)
             &command.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&doing);
  i._3_1_ = 0;
  local_98 = 0;
  local_9c = 1;
  do {
    uVar4 = (ulong)local_9c;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar2 <= uVar4) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&doing);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_330," must be given non-empty COMMAND.",&local_331);
          cmCommand::SetError(&this->super_cmCommand,&local_330);
          std::__cxx11::string::~string((string *)&local_330);
          std::allocator<char>::~allocator(&local_331);
          this_local._7_1_ = false;
          local_d8 = 1;
        }
        else {
          pcVar6 = cmMakefile::GetTest((this->super_cmCommand).Makefile,
                                       (string *)
                                       &configurations.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (pcVar6 == (cmTest *)0x0) {
            local_4d8 = cmMakefile::CreateTest
                                  ((this->super_cmCommand).Makefile,
                                   (string *)
                                   &configurations.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmTest::SetOldStyle(local_4d8,false);
            cmTest::SetCommand(local_4d8,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&doing);
            uVar4 = std::__cxx11::string::empty();
            pcVar6 = local_4d8;
            if ((uVar4 & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4f8,"WORKING_DIRECTORY",&local_4f9);
              value = (char *)std::__cxx11::string::c_str();
              cmTest::SetProperty(pcVar6,&local_4f8,value);
              std::__cxx11::string::~string((string *)&local_4f8);
              std::allocator<char>::~allocator(&local_4f9);
            }
            cmTest::SetCommandExpandLists(local_4d8,(bool)(i._3_1_ & 1));
            this_00 = (this->super_cmCommand).Makefile;
            this_01 = (cmTestGenerator *)operator_new(0x88);
            cmTestGenerator::cmTestGenerator
                      (this_01,local_4d8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&working_directory.field_2 + 8));
            cmMakefile::AddTestGenerator(this_00,this_01);
            this_local._7_1_ = true;
            local_d8 = 1;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
            poVar5 = std::operator<<((ostream *)local_4b0," given test NAME \"");
            poVar5 = std::operator<<(poVar5,(string *)
                                            &configurations.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::operator<<(poVar5,"\" which already exists in this directory.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)&test);
            std::__cxx11::string::~string((string *)&test);
            this_local._7_1_ = false;
            local_d8 = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_308," must be given non-empty NAME.",&local_309);
        cmCommand::SetError(&this->super_cmCommand,&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        std::allocator<char>::~allocator(&local_309);
        this_local._7_1_ = false;
        local_d8 = 1;
      }
LAB_002b4c9e:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&doing);
      std::__cxx11::string::~string
                ((string *)
                 &command.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&working_directory.field_2 + 8));
      std::__cxx11::string::~string
                ((string *)
                 &configurations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return this_local._7_1_;
    }
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_9c);
    bVar1 = std::operator==(pvVar3,"COMMAND");
    if (bVar1) {
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&doing);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0," may be given at most one COMMAND.",&local_d1);
        cmCommand::SetError(&this->super_cmCommand,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::allocator<char>::~allocator(&local_d1);
        this_local._7_1_ = false;
        local_d8 = 1;
        goto LAB_002b4c9e;
      }
      local_98 = 1;
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_9c);
      bVar1 = std::operator==(pvVar3,"CONFIGURATIONS");
      if (bVar1) {
        bVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&working_directory.field_2 + 8));
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8," may be given at most one set of CONFIGURATIONS.",
                     &local_f9);
          cmCommand::SetError(&this->super_cmCommand,&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::allocator<char>::~allocator(&local_f9);
          this_local._7_1_ = false;
          local_d8 = 1;
          goto LAB_002b4c9e;
        }
        local_98 = 2;
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_9c);
        bVar1 = std::operator==(pvVar3,"WORKING_DIRECTORY");
        if (bVar1) {
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_120," may be given at most one WORKING_DIRECTORY.",
                       &local_121);
            cmCommand::SetError(&this->super_cmCommand,&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            std::allocator<char>::~allocator(&local_121);
            this_local._7_1_ = false;
            local_d8 = 1;
            goto LAB_002b4c9e;
          }
          local_98 = 3;
        }
        else {
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)local_9c);
          bVar1 = std::operator==(pvVar3,"COMMAND_EXPAND_LISTS");
          if (bVar1) {
            if ((i._3_1_ & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_148," may be given at most one COMMAND_EXPAND_LISTS.",
                         &local_149);
              cmCommand::SetError(&this->super_cmCommand,&local_148);
              std::__cxx11::string::~string((string *)&local_148);
              std::allocator<char>::~allocator(&local_149);
              this_local._7_1_ = false;
              local_d8 = 1;
              goto LAB_002b4c9e;
            }
            i._3_1_ = 1;
            local_98 = 4;
          }
          else if (local_98 == 0) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)local_9c);
            std::__cxx11::string::operator=
                      ((string *)
                       &configurations.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar3);
            local_98 = 4;
          }
          else if (local_98 == 1) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)local_9c);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&doing,pvVar3);
          }
          else if (local_98 == 2) {
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)local_9c);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)((long)&working_directory.field_2 + 8),pvVar3);
          }
          else {
            if (local_98 != 3) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
              poVar5 = std::operator<<((ostream *)local_2c8," given unknown argument:\n  ");
              pvVar3 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)local_9c);
              poVar5 = std::operator<<(poVar5,(string *)pvVar3);
              std::operator<<(poVar5,"\n");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_2e8);
              std::__cxx11::string::~string((string *)&local_2e8);
              this_local._7_1_ = false;
              local_d8 = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
              goto LAB_002b4c9e;
            }
            pvVar3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)local_9c);
            std::__cxx11::string::operator=
                      ((string *)
                       &command.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar3);
            local_98 = 4;
          }
        }
      }
    }
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool cmAddTestCommand::HandleNameMode(std::vector<std::string> const& args)
{
  std::string name;
  std::vector<std::string> configurations;
  std::string working_directory;
  std::vector<std::string> command;
  bool command_expand_lists = false;

  // Read the arguments.
  enum Doing
  {
    DoingName,
    DoingCommand,
    DoingConfigs,
    DoingWorkingDirectory,
    DoingNone
  };
  Doing doing = DoingName;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "COMMAND") {
      if (!command.empty()) {
        this->SetError(" may be given at most one COMMAND.");
        return false;
      }
      doing = DoingCommand;
    } else if (args[i] == "CONFIGURATIONS") {
      if (!configurations.empty()) {
        this->SetError(" may be given at most one set of CONFIGURATIONS.");
        return false;
      }
      doing = DoingConfigs;
    } else if (args[i] == "WORKING_DIRECTORY") {
      if (!working_directory.empty()) {
        this->SetError(" may be given at most one WORKING_DIRECTORY.");
        return false;
      }
      doing = DoingWorkingDirectory;
    } else if (args[i] == "COMMAND_EXPAND_LISTS") {
      if (command_expand_lists) {
        this->SetError(" may be given at most one COMMAND_EXPAND_LISTS.");
        return false;
      }
      command_expand_lists = true;
      doing = DoingNone;
    } else if (doing == DoingName) {
      name = args[i];
      doing = DoingNone;
    } else if (doing == DoingCommand) {
      command.push_back(args[i]);
    } else if (doing == DoingConfigs) {
      configurations.push_back(args[i]);
    } else if (doing == DoingWorkingDirectory) {
      working_directory = args[i];
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << " given unknown argument:\n  " << args[i] << "\n";
      this->SetError(e.str());
      return false;
    }
  }

  // Require a test name.
  if (name.empty()) {
    this->SetError(" must be given non-empty NAME.");
    return false;
  }

  // Require a command.
  if (command.empty()) {
    this->SetError(" must be given non-empty COMMAND.");
    return false;
  }

  // Require a unique test name within the directory.
  if (this->Makefile->GetTest(name)) {
    std::ostringstream e;
    e << " given test NAME \"" << name
      << "\" which already exists in this directory.";
    this->SetError(e.str());
    return false;
  }

  // Add the test.
  cmTest* test = this->Makefile->CreateTest(name);
  test->SetOldStyle(false);
  test->SetCommand(command);
  if (!working_directory.empty()) {
    test->SetProperty("WORKING_DIRECTORY", working_directory.c_str());
  }
  test->SetCommandExpandLists(command_expand_lists);
  this->Makefile->AddTestGenerator(new cmTestGenerator(test, configurations));

  return true;
}